

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::IsValid(ON_Linetype *this,ON_TextLog *text_log)

{
  eSegType eVar1;
  ON_LinetypePrivate *this_00;
  bool bVar2;
  int iVar3;
  ON_LinetypeSegment *pOVar4;
  int local_30;
  int i;
  int count;
  ON_SimpleArray<ON_LinetypeSegment> *segments;
  ON_TextLog *text_log_local;
  ON_Linetype *this_local;
  
  bVar2 = ON_ModelComponent::IsValid(&this->super_ON_ModelComponent,text_log);
  if (bVar2) {
    this_00 = this->m_private;
    iVar3 = ON_SimpleArray<ON_LinetypeSegment>::Count(&this_00->m_segments);
    if (iVar3 < 1) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Linetype m_segments.Count() = 0\n");
      }
      this_local._7_1_ = false;
    }
    else {
      if (iVar3 == 1) {
        pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,0);
        if (pOVar4->m_length <= 0.0) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,
                              "ON_Linetype bogus single segment linetype - length <= 0.0 (it must be > 0)\n"
                             );
          }
          return false;
        }
        pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,0);
        if (pOVar4->m_seg_type != stLine) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,
                              "ON_Linetype bogus single segment linetype - type != stLine\n");
          }
          return false;
        }
      }
      else {
        for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
          pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,local_30);
          if (pOVar4->m_length <= 0.0 && pOVar4->m_length != 0.0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"ON_Linetype segment has negative length.\n");
            }
            return false;
          }
          pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,local_30);
          if ((pOVar4->m_seg_type != stLine) &&
             (pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,local_30)
             , pOVar4->m_seg_type != stSpace)) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"ON_Linetype segment has invalid m_seg_type.\n");
            }
            return false;
          }
          if (local_30 != 0) {
            pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,local_30);
            eVar1 = pOVar4->m_seg_type;
            pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[]
                               (&this_00->m_segments,local_30 + -1);
            if (eVar1 == pOVar4->m_seg_type) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"ON_Linetype consecutive segments have same type.\n");
              }
              return false;
            }
            pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this_00->m_segments,local_30);
            if ((pOVar4->m_length == 0.0) && (!NAN(pOVar4->m_length))) {
              pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[]
                                 (&this_00->m_segments,local_30 + -1);
              if ((pOVar4->m_length == 0.0) && (!NAN(pOVar4->m_length))) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"ON_Linetype consecutive segments have length zero.\n")
                  ;
                }
                return false;
              }
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Linetype::IsValid( ON_TextLog* text_log ) const
{
  if (false == ON_ModelComponent::IsValid(text_log))
    return false;

  // An ON_Linetype with an empty name is valid.

  const ON_SimpleArray<ON_LinetypeSegment>& segments = m_private->m_segments;
  int count = segments.Count();
  if ( count < 1 )
  {
    if ( text_log )
      text_log->Print("ON_Linetype m_segments.Count() = 0\n");
    return false;
  }

  if ( 1 == count )
  {
    if ( segments[0].m_length <= 0.0  )
    {
      if ( text_log )
        text_log->Print("ON_Linetype bogus single segment linetype - length <= 0.0 (it must be > 0)\n");
      return false;
    }

    if ( ON_LinetypeSegment::eSegType::stLine != segments[0].m_seg_type )
    {
      if ( text_log )
        text_log->Print("ON_Linetype bogus single segment linetype - type != stLine\n");
      return false;
    }
  }
  else
  {
    for (int i = 0; i < count; i++ )
    {
      if ( segments[i].m_length < 0.0 )
      {
        if ( text_log )
          text_log->Print("ON_Linetype segment has negative length.\n");
        return false;
      }

      if ( ON_LinetypeSegment::eSegType::stLine != segments[i].m_seg_type && ON_LinetypeSegment::eSegType::stSpace != segments[i].m_seg_type )
      {
        if ( text_log )
          text_log->Print("ON_Linetype segment has invalid m_seg_type.\n");
        return false;
      }

      if ( i )
      {
        if ( segments[i].m_seg_type == segments[i-1].m_seg_type )
        {
          if ( text_log )
            text_log->Print("ON_Linetype consecutive segments have same type.\n");
          return false;
        }

        if ( 0.0 == segments[i].m_length && 0.0 == segments[i-1].m_length )
        {
          if ( text_log )
            text_log->Print("ON_Linetype consecutive segments have length zero.\n");
          return false;
        }
      }
    }
  }

  return true;
}